

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

void blogc_debug_template(bc_slist_t *ast)

{
  uint uVar1;
  undefined4 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  bc_slist_t *tmp;
  char *pcVar5;
  size_t sStack_40;
  
  do {
    if (ast == (bc_slist_t *)0x0) {
      return;
    }
    puVar2 = (undefined4 *)ast->data;
    fwrite("DEBUG: <TEMPLATE ",0x11,1,_stderr);
    switch(*puVar2) {
    case 1:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "IFDEF: %s";
      break;
    case 2:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "IFNDEF: %s";
      break;
    case 3:
      uVar1 = puVar2[1];
      pcVar5 = "!=";
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar5 = "<";
          if ((uVar1 & 4) == 0) {
            pcVar5 = ">";
            pcVar3 = "";
LAB_00102d37:
            if ((uVar1 & 8) == 0) {
              pcVar5 = pcVar3;
            }
          }
        }
        else {
          pcVar5 = "<=";
          if ((uVar1 & 4) == 0) {
            pcVar5 = ">=";
            pcVar3 = "==";
            goto LAB_00102d37;
          }
        }
      }
      fprintf(_stderr,"IF: %s %s %s",*(undefined8 *)(puVar2 + 2),pcVar5,*(undefined8 *)(puVar2 + 4))
      ;
      goto switchD_00102c0f_default;
    case 4:
      pcVar5 = "ELSE";
      sStack_40 = 4;
      goto LAB_00102cf6;
    case 5:
      pcVar5 = "ENDIF";
      sStack_40 = 5;
      goto LAB_00102cf6;
    case 6:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "FOREACH: %s";
      break;
    case 7:
      pcVar5 = "ENDFOREACH";
      sStack_40 = 10;
      goto LAB_00102cf6;
    case 8:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "BLOCK: %s";
      break;
    case 9:
      pcVar5 = "ENDBLOCK";
      sStack_40 = 8;
LAB_00102cf6:
      fwrite(pcVar5,sStack_40,1,_stderr);
      goto switchD_00102c0f_default;
    case 10:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "VARIABLE: %s";
      break;
    case 0xb:
      uVar4 = *(undefined8 *)(puVar2 + 2);
      pcVar5 = "CONTENT: `%s`";
      break;
    default:
      goto switchD_00102c0f_default;
    }
    fprintf(_stderr,pcVar5,uVar4);
switchD_00102c0f_default:
    fwrite(">\n",2,1,_stderr);
    ast = ast->next;
  } while( true );
}

Assistant:

void
blogc_debug_template(bc_slist_t *ast)
{
    for (bc_slist_t *tmp = ast; tmp != NULL; tmp = tmp->next) {
        blogc_template_node_t *data = tmp->data;
        fprintf(stderr, "DEBUG: <TEMPLATE ");
        switch (data->type) {
            case BLOGC_TEMPLATE_NODE_IFDEF:
                fprintf(stderr, "IFDEF: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_IFNDEF:
                fprintf(stderr, "IFNDEF: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_IF:
                fprintf(stderr, "IF: %s %s %s", data->data[0],
                    get_operator(data->op), data->data[1]);
                break;
            case BLOGC_TEMPLATE_NODE_ELSE:
                fprintf(stderr, "ELSE");
                break;
            case BLOGC_TEMPLATE_NODE_ENDIF:
                fprintf(stderr, "ENDIF");
                break;
            case BLOGC_TEMPLATE_NODE_FOREACH:
                fprintf(stderr, "FOREACH: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                fprintf(stderr, "ENDFOREACH");
                break;
            case BLOGC_TEMPLATE_NODE_BLOCK:
                fprintf(stderr, "BLOCK: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                fprintf(stderr, "ENDBLOCK");
                break;
            case BLOGC_TEMPLATE_NODE_VARIABLE:
                fprintf(stderr, "VARIABLE: %s", data->data[0]);
                break;
            case BLOGC_TEMPLATE_NODE_CONTENT:
                fprintf(stderr, "CONTENT: `%s`", data->data[0]);
                break;
        }
        fprintf(stderr, ">\n");
    }
}